

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O2

int get_response_value(http_message_t *hmsg,int code,char *name,int *upnp_error_code,
                      IXML_Node **action_value,char **str_value)

{
  int iVar1;
  int iVar2;
  IXML_Node *pIVar3;
  char *pcVar4;
  char *buffer;
  IXML_Node *node;
  char **local_70;
  IXML_Document *doc;
  IXML_Node *error_node;
  char *names [5];
  
  node = (IXML_Node *)0x0;
  error_node = (IXML_Node *)0x0;
  doc = (IXML_Document *)0x0;
  iVar2 = -0x71;
  if ((((hmsg->status_code == 500) || (hmsg->status_code == 200)) &&
      (local_70 = str_value, iVar1 = has_xml_content_type(hmsg), iVar1 != 0)) &&
     ((iVar1 = ixmlParseBufferEx((hmsg->entity).buf,&doc), iVar1 == 0 &&
      (pIVar3 = ixmlNode_getFirstChild(&doc->n), pIVar3 != (IXML_Node *)0x0)))) {
    if (code != 1) {
      if (local_70 == (char **)0x0) {
        __assert_fail("str_value != NULL",".upnp/src/soap/soap_ctrlpt.c",0x1a4,
                      "int get_response_value(http_message_t *, int, char *, int *, IXML_Node **, char **)"
                     );
      }
      *local_70 = (char *)0x0;
      names[0] = "Envelope";
      names[1] = "Body";
      names[2] = "QueryStateVariableResponse";
      names[3] = "return";
      iVar1 = dom_find_deep_node(names,4,pIVar3,&node);
      if (iVar1 != 0) goto LAB_0011972a;
      pcVar4 = get_node_value(node);
      if (pcVar4 != (char *)0x0) {
        pcVar4 = ixmlCloneDOMString(pcVar4);
        *local_70 = pcVar4;
        iVar2 = 2;
      }
      goto LAB_00119619;
    }
    if (action_value == (IXML_Node **)0x0) {
      __assert_fail("action_value != NULL",".upnp/src/soap/soap_ctrlpt.c",0x18c,
                    "int get_response_value(http_message_t *, int, char *, int *, IXML_Node **, char **)"
                   );
    }
    *action_value = (IXML_Node *)0x0;
    names[0] = "Envelope";
    names[1] = "Body";
    names[2] = name;
    iVar1 = dom_find_deep_node(names,3,pIVar3,&node);
    if (iVar1 != 0) {
LAB_0011972a:
      *local_70 = (char *)0x0;
      names[0] = "Envelope";
      names[1] = "Body";
      names[2] = "Fault";
      names[3] = "detail";
      names[4] = "UPnPError";
      iVar1 = dom_find_deep_node(names,5,pIVar3,&error_node);
      pIVar3 = error_node;
      if (((iVar1 == 0) && (iVar1 = dom_find_node("errorCode",error_node,&node), iVar1 == 0)) &&
         (pcVar4 = get_node_value(node), pcVar4 != (char *)0x0)) {
        iVar1 = atoi(pcVar4);
        *upnp_error_code = iVar1;
        if (400 < iVar1) {
          pcVar4 = (char *)0x0;
          buffer = (char *)0x0;
          goto LAB_0011961f;
        }
        if (code == 2) {
          iVar1 = dom_find_node("errorDescription",pIVar3,&node);
          if ((iVar1 == 0) && (pcVar4 = get_node_value(node), pcVar4 != (char *)0x0)) {
            pcVar4 = ixmlCloneDOMString(pcVar4);
            *local_70 = pcVar4;
            iVar2 = -0x71;
            if (pcVar4 != (char *)0x0) {
              iVar2 = 4;
            }
          }
        }
        else if (code == 1) {
          buffer = ixmlPrintNode(pIVar3);
          if (buffer != (char *)0x0) {
            iVar2 = ixmlParseBufferEx(buffer,(IXML_Document **)action_value);
            iVar1 = -0x71;
            if (iVar2 == 0) {
              iVar1 = 3;
            }
            pcVar4 = (char *)0x0;
            goto LAB_0011961f;
          }
          goto LAB_00119889;
        }
      }
      goto LAB_00119619;
    }
    pcVar4 = ixmlPrintNode(node);
    if (pcVar4 == (char *)0x0) {
LAB_00119889:
      iVar2 = -0x68;
      goto LAB_00119619;
    }
    iVar2 = ixmlParseBufferEx(pcVar4,(IXML_Document **)action_value);
    iVar1 = -0x71;
    if (iVar2 == 0) {
      iVar1 = 1;
    }
  }
  else {
LAB_00119619:
    pcVar4 = (char *)0x0;
    iVar1 = iVar2;
  }
  buffer = (char *)0x0;
LAB_0011961f:
  ixmlDocument_free(doc);
  ixmlFreeDOMString(pcVar4);
  ixmlFreeDOMString(buffer);
  return iVar1;
}

Assistant:

static int get_response_value(http_message_t *hmsg,
	int code,
	char *name,
	int *upnp_error_code,
	IXML_Node **action_value,
	DOMString *str_value)
{
	IXML_Node *node = NULL;
	IXML_Node *root_node = NULL;
	IXML_Node *error_node = NULL;
	IXML_Document *doc = NULL;
	char *node_str = NULL;
	const char *temp_str = NULL;
	DOMString error_node_str = NULL;
	int err_code = UPNP_E_BAD_RESPONSE; /* default error */
	int done = 0;
	const char *names[5];
	const DOMString nodeValue;

	/* only 200 and 500 status codes are relevant */
	if ((hmsg->status_code != HTTP_OK &&
		    hmsg->status_code != HTTP_INTERNAL_SERVER_ERROR) ||
		!has_xml_content_type(hmsg))
		goto error_handler;
	if (ixmlParseBufferEx(hmsg->entity.buf, &doc) != IXML_SUCCESS)
		goto error_handler;
	root_node = ixmlNode_getFirstChild((IXML_Node *)doc);
	if (root_node == NULL)
		goto error_handler;
	if (code == SOAP_ACTION_RESP) {
		/* try reading soap action response */
		assert(action_value != NULL);

		*action_value = NULL;
		names[0] = "Envelope";
		names[1] = "Body";
		names[2] = name;
		if (dom_find_deep_node(names, 3, root_node, &node) ==
			UPNP_E_SUCCESS) {
			node_str = ixmlPrintNode(node);
			if (node_str == NULL) {
				err_code = UPNP_E_OUTOF_MEMORY;
				goto error_handler;
			}
			if (ixmlParseBufferEx(
				    node_str, (IXML_Document **)action_value) !=
				IXML_SUCCESS) {
				err_code = UPNP_E_BAD_RESPONSE;
				goto error_handler;
			}
			err_code = SOAP_ACTION_RESP;
			done = 1;
		}
	} else if (code == SOAP_VAR_RESP) {
		/* try reading var response */
		assert(str_value != NULL);

		*str_value = NULL;
		names[0] = "Envelope";
		names[1] = "Body";
		names[2] = "QueryStateVariableResponse";
		names[3] = "return";
		if (dom_find_deep_node(names, 4, root_node, &node) ==
			UPNP_E_SUCCESS) {
			nodeValue = get_node_value(node);
			if (nodeValue == NULL)
				goto error_handler;
			*str_value = ixmlCloneDOMString(nodeValue);
			err_code = SOAP_VAR_RESP;
			done = 1;
		}
	}
	if (!done) {
		/* not action or var resp; read error code and description */
		*str_value = NULL;
		names[0] = "Envelope";
		names[1] = "Body";
		names[2] = "Fault";
		names[3] = "detail";
		names[4] = "UPnPError";
		if (dom_find_deep_node(names, 5, root_node, &error_node) !=
			UPNP_E_SUCCESS)
			goto error_handler;
		if (dom_find_node("errorCode", error_node, &node) !=
			UPNP_E_SUCCESS)
			goto error_handler;
		temp_str = get_node_value(node);
		if (!temp_str)
			goto error_handler;
		*upnp_error_code = atoi(temp_str);
		if (*upnp_error_code > 400) {
			err_code = *upnp_error_code;
			goto error_handler; /* bad SOAP error code */
		}
		if (code == SOAP_VAR_RESP) {
			if (dom_find_node("errorDescription",
				    error_node,
				    &node) != UPNP_E_SUCCESS) {
				goto error_handler;
			}
			nodeValue = get_node_value(node);
			if (nodeValue == NULL) {
				goto error_handler;
			}
			*str_value = ixmlCloneDOMString(nodeValue);
			if (*str_value == NULL) {
				goto error_handler;
			}
			err_code = SOAP_VAR_RESP_ERROR;
		} else if (code == SOAP_ACTION_RESP) {
			error_node_str = ixmlPrintNode(error_node);
			if (error_node_str == NULL) {
				err_code = UPNP_E_OUTOF_MEMORY;
				goto error_handler;
			}
			if (ixmlParseBufferEx(error_node_str,
				    (IXML_Document **)action_value) !=
				IXML_SUCCESS) {
				err_code = UPNP_E_BAD_RESPONSE;

				goto error_handler;
			}
			err_code = SOAP_ACTION_RESP_ERROR;
		}
	}

error_handler:
	ixmlDocument_free(doc);
	ixmlFreeDOMString(node_str);
	ixmlFreeDOMString(error_node_str);
	return err_code;
}